

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
gtl::
dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
::
insert<gtl::dense_hashtable_const_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>
          (dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
           *this)

{
  uint *puVar1;
  long lVar2;
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  *f;
  uint *in_stack_00000010;
  pointer in_stack_00000018;
  uint *in_stack_00000028;
  pair<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>,_bool>
  local_48;
  
  puVar1 = in_stack_00000028;
  local_48.first.ht = f;
  local_48.first.pos = in_stack_00000010;
  local_48.first.end = in_stack_00000018;
  if (in_stack_00000010 != in_stack_00000028) {
    lVar2 = 0;
    do {
      dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
      ::operator++((dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                    *)&local_48);
      lVar2 = lVar2 + -1;
    } while (local_48.first.pos != puVar1);
    dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
    ::resize_delta((dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                    *)this,-lVar2);
    do {
      insert_noresize<unsigned_int_const&>(&local_48,this,in_stack_00000010);
      dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
      ::operator++((dense_hashtable_const_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                    *)&stack0x00000008);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    return;
  }
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::resize_delta((dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                  *)this,0);
  return;
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= std::numeric_limits<size_type>::max()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for ( ; dist > 0; --dist, ++f) {
      insert_noresize(*f);
    }
  }